

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O2

crn_block_compressor_context_t crn_create_block_compressor(crn_comp_params *params)

{
  int iVar1;
  crn_block_compressor *this;
  
  this = crnlib::crnlib_new<crnlib::crn_block_compressor>();
  iVar1 = crnlib::crn_block_compressor::init(this,(EVP_PKEY_CTX *)params);
  if ((char)iVar1 == '\0') {
    crnlib::crnlib_delete<crnlib::crn_block_compressor>(this);
    this = (crn_block_compressor *)0x0;
  }
  return this;
}

Assistant:

crn_block_compressor_context_t crn_create_block_compressor(const crn_comp_params& params)
{
    crn_block_compressor* pComp = crnlib_new<crn_block_compressor>();
    if (!pComp->init(params))
    {
        crnlib_delete(pComp);
        return nullptr;
    }
    return pComp;
}